

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mpp_parse_cfg.c
# Opt level: O2

char * read_cfg_line(cfg_file *cfg)

{
  int iVar1;
  int iVar2;
  char *pcVar3;
  ulong uVar4;
  
  pcVar3 = cfg->cache;
  do {
    if (cfg->cache_on != 0) break;
    uVar4 = 0;
    while( true ) {
      iVar1 = fgetc((FILE *)cfg->file);
      if (uVar4 == 0 && iVar1 == -1) {
        return (char *)0x0;
      }
      if (iVar1 == -1) break;
      iVar2 = feof((FILE *)cfg->file);
      if ((iVar1 == 10) || (iVar2 != 0)) break;
      cfg->cache[uVar4] = (char)iVar1;
      uVar4 = uVar4 + 1;
    }
    pcVar3[uVar4 & 0xffffffff] = '\0';
  } while (*pcVar3 == '#');
  cfg->cache_on = 1;
  pcVar3 = string_trim(pcVar3);
  return pcVar3;
}

Assistant:

static char *read_cfg_line(struct cfg_file *cfg)
{
    int ch;
    int i;

    while (!cfg->cache_on) {
        i = 0;

        while (1) {
            ch = fgetc(cfg->file);
            if (i == 0 && ch == EOF)
                return NULL;
            else if (ch == EOF || feof(cfg->file) || ch == '\n')
                break;

            cfg->cache[i++] = ch;
        }
        cfg->cache[i] = '\0';

        /* a note, ignore and get the next line */
        if (cfg->cache[0] != '#')
            break;
    }

    cfg->cache_on = 1;
    return string_trim(cfg->cache);
}